

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsRectItem::QGraphicsRectItem(QGraphicsRectItem *this,QGraphicsItem *parent)

{
  QGraphicsRectItemPrivate *this_00;
  
  this_00 = (QGraphicsRectItemPrivate *)operator_new(0x1c8);
  QGraphicsRectItemPrivate::QGraphicsRectItemPrivate(this_00);
  QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem
            (&this->super_QAbstractGraphicsShapeItem,(QAbstractGraphicsShapeItemPrivate *)this_00,
             parent);
  (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem._vptr_QGraphicsItem =
       (_func_int **)&PTR__QGraphicsPixmapItem_007eb990;
  return;
}

Assistant:

QGraphicsRectItem::QGraphicsRectItem(QGraphicsItem *parent)
    : QAbstractGraphicsShapeItem(*new QGraphicsRectItemPrivate, parent)
{
}